

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O0

sFrameOfData * Cortex_GetCurrentFrame(void)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  int retCode;
  int nTries;
  int bytesSent;
  int local_10;
  sFrameOfData *local_8;
  
  PacketOut.iCommand = 0xc;
  PacketOut.nBytes = 0;
  uVar1 = SendToCortex((sPacket *)0x1066a2);
  LogMessage(4,"Cortex_GetCurrentFrame(), SendToCortex sent %d bytes",(ulong)uVar1);
  local_10 = 2000;
  while( true ) {
    while( true ) {
      iVar5 = local_10 + -1;
      if (local_10 == 0) {
        return (sFrameOfData *)0x0;
      }
      iVar2 = sem_trywait((sem_t *)&EH_CommandConfirmed);
      local_10 = iVar5;
      if (iVar2 == 0) break;
      piVar3 = __errno_location();
      if (*piVar3 == 0xb) {
        usleep(10);
      }
      else {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        LogMessage(4,"Error in semaphore timeout in GetCurrentFrame: %s",pcVar4);
      }
    }
    if (PacketIn.iCommand == 0xd) break;
    if (PacketIn.iCommand == 0xf) {
      LogMessage(4,"GENERAL_REPLY message");
    }
  }
  LogMessage(4,"FRAME_OF_DATA message");
  local_8 = &Polled_FrameOfData;
  return local_8;
}

Assistant:

sFrameOfData* Cortex_GetCurrentFrame()
{
  PacketOut.iCommand = PKT2_REQUEST_FRAME;
  PacketOut.nBytes = 0;

  int bytesSent = SendToCortex(&PacketOut);
  LogMessage(VL_Debug, "Cortex_GetCurrentFrame(), SendToCortex sent %d bytes",
             bytesSent);

  int nTries = 2000;
  while (nTries--) {
    int retCode = sem_trywait(&EH_CommandConfirmed);
    if (!retCode) {
      if (PacketIn.iCommand == PKT2_FRAME_OF_DATA) {
        LogMessage(VL_Debug, "FRAME_OF_DATA message");
        return &Polled_FrameOfData;
      } else if (PacketIn.iCommand == PKT2_GENERAL_REPLY) {
        LogMessage(VL_Debug, "GENERAL_REPLY message");
      }
    } else {
      if (errno == EAGAIN) { // semaphore still locked
        usleep(10);
      } else {
        LogMessage(VL_Debug,
                   "Error in semaphore timeout in GetCurrentFrame: %s",
                   strerror(errno));
      }

    }
  }

  return NULL;
}